

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O1

NewLineIdentifier duckdb::CSVSniffer::DetectNewLineDelimiter(CSVBufferManager *buffer_manager)

{
  data_t dVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  bool bVar4;
  NewLineIdentifier NVar5;
  CSVBufferHandle *pCVar6;
  optional_ptr<duckdb::FileBuffer,_true> *this;
  NewLineIdentifier NVar7;
  idx_t i;
  ulong uVar8;
  shared_ptr<duckdb::CSVBufferHandle,_true> buffer;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  CSVBufferManager::GetBuffer((CSVBufferManager *)&stack0xffffffffffffffc8,(idx_t)buffer_manager);
  pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                     ((shared_ptr<duckdb::CSVBufferHandle,_true> *)&stack0xffffffffffffffc8);
  this = &(pCVar6->handle).node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this);
  pdVar2 = this->ptr->buffer;
  bVar3 = false;
  uVar8 = 0;
  NVar7 = SINGLE_R;
  do {
    pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                       ((shared_ptr<duckdb::CSVBufferHandle,_true> *)&stack0xffffffffffffffc8);
    if (pCVar6->actual_size <= uVar8) {
LAB_01529f8f:
      if ((ClientContext *)local_30._M_pi != (ClientContext *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
      }
      NVar5 = SINGLE_N;
      if (bVar3) {
        NVar5 = NVar7;
      }
      return NVar5;
    }
    dVar1 = pdVar2[uVar8];
    bVar4 = true;
    if (dVar1 != '\r') {
      if (dVar1 == '\n') {
        NVar7 = CARRY_ON;
        goto LAB_01529f8f;
      }
      bVar4 = bVar3;
      if (bVar3) goto LAB_01529f8f;
    }
    bVar3 = bVar4;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

NewLineIdentifier CSVSniffer::DetectNewLineDelimiter(CSVBufferManager &buffer_manager) {
	// Get first buffer
	auto buffer = buffer_manager.GetBuffer(0);
	auto buffer_ptr = buffer->Ptr();
	bool carriage_return = false;
	bool n = false;
	for (idx_t i = 0; i < buffer->actual_size; i++) {
		if (buffer_ptr[i] == '\r') {
			carriage_return = true;
		} else if (buffer_ptr[i] == '\n') {
			n = true;
			break;
		} else if (carriage_return) {
			break;
		}
	}
	if (carriage_return && n) {
		return NewLineIdentifier::CARRY_ON;
	}
	if (carriage_return) {
		return NewLineIdentifier::SINGLE_R;
	}
	return NewLineIdentifier::SINGLE_N;
}